

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.h
# Opt level: O3

decoder_tables * __thiscall
crnlib::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  uint16 *puVar1;
  void *pvVar2;
  uint32 *puVar3;
  uint uVar4;
  
  if (this != other) {
    puVar3 = this->m_lookup;
    if (puVar3 != (uint32 *)0x0) {
      if ((puVar3[-2] ^ puVar3[-1]) == 0xffffffff) {
        crnlib_free(puVar3 + -4);
      }
      this->m_lookup = (uint32 *)0x0;
      this->m_cur_lookup_size = 0;
    }
    puVar1 = this->m_sorted_symbol_order;
    if (puVar1 != (uint16 *)0x0) {
      if ((*(uint *)(puVar1 + -4) ^ *(uint *)(puVar1 + -2)) == 0xffffffff) {
        crnlib_free(puVar1 + -8);
      }
      this->m_sorted_symbol_order = (uint16 *)0x0;
      this->m_cur_sorted_symbol_order_size = 0;
    }
    memcpy(this,other,0xc0);
    if (other->m_lookup != (uint32 *)0x0) {
      uVar4 = this->m_cur_lookup_size;
      if (uVar4 < 0xfffffffd) {
        uVar4 = uVar4 + (uVar4 == 0);
        pvVar2 = crnlib_malloc((ulong)uVar4 * 4 + 0x10);
        puVar3 = (uint32 *)((long)pvVar2 + 0x10);
        *(uint *)((long)pvVar2 + 0xc) = uVar4;
        *(uint *)((long)pvVar2 + 8) = ~uVar4;
      }
      else {
        crnlib_mem_error("crnlib_new_array: Array too large!");
        puVar3 = (uint32 *)0x0;
      }
      this->m_lookup = puVar3;
      memcpy(puVar3,other->m_lookup,(ulong)this->m_cur_lookup_size << 2);
    }
    if (other->m_sorted_symbol_order != (uint16 *)0x0) {
      uVar4 = this->m_cur_sorted_symbol_order_size +
              (uint)(this->m_cur_sorted_symbol_order_size == 0);
      pvVar2 = crnlib_malloc((ulong)uVar4 * 2 + 0x10);
      *(uint *)((long)pvVar2 + 0xc) = uVar4;
      *(uint *)((long)pvVar2 + 8) = ~uVar4;
      this->m_sorted_symbol_order = (uint16 *)((long)pvVar2 + 0x10);
      memcpy((uint16 *)((long)pvVar2 + 0x10),other->m_sorted_symbol_order,
             (ulong)this->m_cur_sorted_symbol_order_size * 2);
    }
  }
  return this;
}

Assistant:

decoder_tables& operator=(const decoder_tables& other)
            {
                if (this == &other)
                {
                    return *this;
                }

                clear();

                memcpy(this, &other, sizeof(*this));

                if (other.m_lookup)
                {
                    m_lookup = crnlib_new_array<uint32>(m_cur_lookup_size);
                    memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
                }

                if (other.m_sorted_symbol_order)
                {
                    m_sorted_symbol_order = crnlib_new_array<uint16>(m_cur_sorted_symbol_order_size);
                    memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
                }

                return *this;
            }